

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O3

LY_ERR lys_compile_type_(lysc_ctx *ctx,lysp_node *context_pnode,uint16_t context_flags,
                        char *context_name,lysp_type *type_p,LY_DATA_TYPE basetype,char *tpdfname,
                        lysc_type *base,lyplg_type *plugin,ly_set *tpdf_chain,
                        uint32_t tpdf_chain_last,lysc_type **type)

{
  lysc_type *range;
  void **ppvVar1;
  int *piVar2;
  long lVar3;
  lyd_node *plVar4;
  lysp_ext_instance *plVar5;
  uint8_t frdigits;
  LY_ERR LVar6;
  lysc_type *plVar7;
  lysc_range *plVar8;
  LY_DATA_TYPE *pLVar9;
  lysc_ext_instance *plVar10;
  lysp_ext_instance *plVar11;
  lysp_ext_instance *plVar12;
  long *plVar13;
  ulong uVar14;
  char *pcVar15;
  lysc_type_bitenum_item *base_enums;
  LY_VECODE LVar16;
  LY_DATA_TYPE LVar17;
  void *pvVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  size_t sVar22;
  lysp_type_enum *plVar23;
  lyxp_expr *exp;
  lysp_restr *plVar24;
  ly_ctx *plVar25;
  char *pcVar26;
  lysc_ext_instance **range_00;
  long lVar27;
  lysp_restr **pplVar28;
  long *plVar29;
  LY_VALUE_FORMAT local_34;
  
  plVar25 = ctx->ctx;
  *type = (lysc_type *)0x0;
  switch(basetype - LY_TYPE_BINARY) {
  case LY_TYPE_UNKNOWN:
  case LY_TYPE_BINARY:
  case LY_TYPE_UINT8:
  case LY_TYPE_UINT16:
  case LY_TYPE_UINT32:
  case LY_TYPE_STRING:
  case LY_TYPE_EMPTY:
  case LY_TYPE_ENUM:
  case LY_TYPE_IDENT:
  case LY_TYPE_LEAFREF:
  case LY_TYPE_UNION:
  case LY_TYPE_INT8:
  case LY_TYPE_INT16:
  case LY_TYPE_INT32:
    sVar22 = 0x28;
    break;
  case LY_TYPE_UINT64:
  case LY_TYPE_BOOL:
    sVar22 = 0x30;
    break;
  case LY_TYPE_BITS:
  case LY_TYPE_DEC64:
    sVar22 = 0x20;
    break;
  case LY_TYPE_INST:
    sVar22 = 0x40;
    break;
  default:
    goto switchD_00146f29_default;
  }
  plVar7 = (lysc_type *)calloc(1,sVar22);
  if (plVar7 == (lysc_type *)0x0) {
switchD_00146f29_default:
    LVar6 = LY_EMEM;
    ly_log(plVar25,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_new_type");
    plVar7 = (lysc_type *)0x0;
LAB_00146fa5:
    free(plVar7);
    goto LAB_00146fba;
  }
  if ((tpdfname != (char *)0x0) &&
     (LVar6 = lydict_insert(plVar25,tpdfname,0,(char **)plVar7), LVar6 != LY_SUCCESS))
  goto LAB_00146fa5;
  *type = plVar7;
  plVar7->basetype = basetype;
  plVar7->plugin = plugin;
  switch(basetype - LY_TYPE_BINARY) {
  case LY_TYPE_UNKNOWN:
    if (type_p->length != (lysp_restr *)0x0) {
      if (base == (lysc_type *)0x0) {
        plVar8 = (lysc_range *)0x0;
      }
      else {
        plVar8 = (lysc_range *)base[1].name;
      }
      plVar7 = plVar7 + 1;
      LVar6 = lys_compile_type_range
                        (ctx,type_p->length,LY_TYPE_BINARY,'\x01','\0',plVar8,(lysc_range **)plVar7)
      ;
      if (LVar6 != LY_SUCCESS) goto LAB_00146fba;
      if ((tpdfname == (char *)0x0) &&
         (plVar11 = type_p->length->exts, plVar11 != (lysp_ext_instance *)0x0)) {
        plVar8 = (lysc_range *)plVar7->name;
        plVar10 = plVar8->exts;
        if (plVar10 == (lysc_ext_instance *)0x0) {
          plVar13 = (long *)calloc(1,(long)plVar11[-1].exts * 0x48 + 8);
          if (plVar13 != (long *)0x0) {
            pvVar18 = (void *)0x0;
            goto LAB_00147e2a;
          }
        }
        else {
          pvVar18 = plVar10[-1].compiled;
          plVar13 = (long *)realloc(&plVar10[-1].compiled,
                                    ((long)&(plVar11[-1].exts)->name + (long)pvVar18 * 2) * 0x48 + 8
                                   );
          if (plVar13 != (long *)0x0) {
            plVar8 = (lysc_range *)plVar7->name;
LAB_00147e2a:
            plVar8->exts = (lysc_ext_instance *)(plVar13 + 1);
            plVar10 = ((lysc_range *)plVar7->name)->exts;
            if (plVar10 != (lysc_ext_instance *)0x0) {
              plVar11 = type_p->length->exts;
              if (plVar11 == (lysp_ext_instance *)0x0) {
                plVar11 = (lysp_ext_instance *)0x0;
              }
              else {
                plVar11 = plVar11[-1].exts;
              }
              memset(plVar10 + *plVar13,0,((long)&plVar11->name + (long)pvVar18) * 0x48);
            }
            lVar27 = 0;
            plVar11 = (lysp_ext_instance *)0x0;
            while( true ) {
              plVar5 = type_p->length->exts;
              if (plVar5 == (lysp_ext_instance *)0x0) {
                plVar12 = (lysp_ext_instance *)0x0;
              }
              else {
                plVar12 = plVar5[-1].exts;
              }
              if (plVar12 <= plVar11) break;
              plVar8 = (lysc_range *)plVar7->name;
              plVar10 = plVar8->exts;
              pvVar18 = plVar10[-1].compiled;
              plVar10[-1].compiled = (void *)((long)pvVar18 + 1);
              LVar6 = lys_compile_ext(ctx,(lysp_ext_instance *)((long)&plVar5->name + lVar27),
                                      plVar10 + (long)pvVar18,plVar8);
              if (LVar6 != LY_SUCCESS) {
                if (LVar6 != LY_ENOT) goto LAB_00146fba;
                ppvVar1 = &((lysc_range *)plVar7->name)->exts[-1].compiled;
                *ppvVar1 = (void *)((long)*ppvVar1 + -1);
              }
              plVar11 = (lysp_ext_instance *)((long)&plVar11->name + 1);
              lVar27 = lVar27 + 0x70;
            }
            break;
          }
        }
        goto LAB_0014835b;
      }
    }
    break;
  case LY_TYPE_BINARY:
  case LY_TYPE_UINT8:
  case LY_TYPE_UINT16:
  case LY_TYPE_UINT32:
  case LY_TYPE_UNION:
  case LY_TYPE_INT8:
  case LY_TYPE_INT16:
  case LY_TYPE_INT32:
    if (type_p->range != (lysp_restr *)0x0) {
      if (base == (lysc_type *)0x0) {
        plVar8 = (lysc_range *)0x0;
      }
      else {
        plVar8 = (lysc_range *)base[1].name;
      }
      plVar7 = plVar7 + 1;
      LVar6 = lys_compile_type_range
                        (ctx,type_p->range,basetype,'\0','\0',plVar8,(lysc_range **)plVar7);
      if (LVar6 != LY_SUCCESS) goto LAB_00146fba;
      if ((tpdfname == (char *)0x0) &&
         (plVar11 = type_p->range->exts, plVar11 != (lysp_ext_instance *)0x0)) {
        plVar8 = (lysc_range *)plVar7->name;
        plVar10 = plVar8->exts;
        if (plVar10 == (lysc_ext_instance *)0x0) {
          plVar13 = (long *)calloc(1,(long)plVar11[-1].exts * 0x48 + 8);
          if (plVar13 != (long *)0x0) {
            pvVar18 = (void *)0x0;
            goto LAB_0014780a;
          }
        }
        else {
          pvVar18 = plVar10[-1].compiled;
          plVar13 = (long *)realloc(&plVar10[-1].compiled,
                                    ((long)&(plVar11[-1].exts)->name + (long)pvVar18 * 2) * 0x48 + 8
                                   );
          if (plVar13 != (long *)0x0) {
            plVar8 = (lysc_range *)plVar7->name;
LAB_0014780a:
            plVar8->exts = (lysc_ext_instance *)(plVar13 + 1);
            plVar10 = ((lysc_range *)plVar7->name)->exts;
            if (plVar10 != (lysc_ext_instance *)0x0) {
              plVar11 = type_p->range->exts;
              if (plVar11 == (lysp_ext_instance *)0x0) {
                plVar11 = (lysp_ext_instance *)0x0;
              }
              else {
                plVar11 = plVar11[-1].exts;
              }
              memset(plVar10 + *plVar13,0,((long)&plVar11->name + (long)pvVar18) * 0x48);
            }
            lVar27 = 0;
            plVar11 = (lysp_ext_instance *)0x0;
            while( true ) {
              plVar5 = type_p->range->exts;
              if (plVar5 == (lysp_ext_instance *)0x0) {
                plVar12 = (lysp_ext_instance *)0x0;
              }
              else {
                plVar12 = plVar5[-1].exts;
              }
              if (plVar12 <= plVar11) break;
              plVar8 = (lysc_range *)plVar7->name;
              plVar10 = plVar8->exts;
              pvVar18 = plVar10[-1].compiled;
              plVar10[-1].compiled = (void *)((long)pvVar18 + 1);
              LVar6 = lys_compile_ext(ctx,(lysp_ext_instance *)((long)&plVar5->name + lVar27),
                                      plVar10 + (long)pvVar18,plVar8);
              if (LVar6 != LY_SUCCESS) {
                if (LVar6 != LY_ENOT) goto LAB_00146fba;
                ppvVar1 = &((lysc_range *)plVar7->name)->exts[-1].compiled;
                *ppvVar1 = (void *)((long)*ppvVar1 + -1);
              }
              plVar11 = (lysp_ext_instance *)((long)&plVar11->name + 1);
              lVar27 = lVar27 + 0x70;
            }
            break;
          }
        }
        goto LAB_0014835b;
      }
    }
    break;
  case LY_TYPE_UINT64:
    if (type_p->length != (lysp_restr *)0x0) {
      if (base == (lysc_type *)0x0) {
        plVar8 = (lysc_range *)0x0;
      }
      else {
        plVar8 = (lysc_range *)base[1].name;
      }
      range = plVar7 + 1;
      LVar6 = lys_compile_type_range
                        (ctx,type_p->length,LY_TYPE_STRING,'\x01','\0',plVar8,(lysc_range **)range);
      if (LVar6 != LY_SUCCESS) goto LAB_00146fba;
      if ((tpdfname != (char *)0x0) ||
         (plVar11 = type_p->length->exts, plVar11 == (lysp_ext_instance *)0x0)) goto LAB_001475fb;
      plVar8 = (lysc_range *)range->name;
      plVar10 = plVar8->exts;
      if (plVar10 == (lysc_ext_instance *)0x0) {
        plVar13 = (long *)calloc(1,(long)plVar11[-1].exts * 0x48 + 8);
        if (plVar13 != (long *)0x0) {
          pvVar18 = (void *)0x0;
          goto LAB_00147db2;
        }
      }
      else {
        pvVar18 = plVar10[-1].compiled;
        plVar13 = (long *)realloc(&plVar10[-1].compiled,
                                  ((long)&(plVar11[-1].exts)->name + (long)pvVar18 * 2) * 0x48 + 8);
        if (plVar13 != (long *)0x0) {
          plVar8 = (lysc_range *)range->name;
LAB_00147db2:
          plVar8->exts = (lysc_ext_instance *)(plVar13 + 1);
          plVar10 = ((lysc_range *)range->name)->exts;
          if (plVar10 != (lysc_ext_instance *)0x0) {
            plVar11 = type_p->length->exts;
            if (plVar11 == (lysp_ext_instance *)0x0) {
              plVar11 = (lysp_ext_instance *)0x0;
            }
            else {
              plVar11 = plVar11[-1].exts;
            }
            memset(plVar10 + *plVar13,0,((long)&plVar11->name + (long)pvVar18) * 0x48);
          }
          lVar27 = 0;
          plVar11 = (lysp_ext_instance *)0x0;
          while( true ) {
            plVar5 = type_p->length->exts;
            if (plVar5 == (lysp_ext_instance *)0x0) {
              plVar12 = (lysp_ext_instance *)0x0;
            }
            else {
              plVar12 = plVar5[-1].exts;
            }
            if (plVar12 <= plVar11) break;
            plVar8 = (lysc_range *)range->name;
            plVar10 = plVar8->exts;
            pvVar18 = plVar10[-1].compiled;
            plVar10[-1].compiled = (void *)((long)pvVar18 + 1);
            LVar6 = lys_compile_ext(ctx,(lysp_ext_instance *)((long)&plVar5->name + lVar27),
                                    plVar10 + (long)pvVar18,plVar8);
            if (LVar6 != LY_SUCCESS) {
              if (LVar6 != LY_ENOT) goto LAB_00146fba;
              ppvVar1 = &((lysc_range *)range->name)->exts[-1].compiled;
              *ppvVar1 = (void *)((long)*ppvVar1 + -1);
            }
            plVar11 = (lysp_ext_instance *)((long)&plVar11->name + 1);
            lVar27 = lVar27 + 0x70;
          }
          goto LAB_001475fb;
        }
      }
      goto LAB_0014835b;
    }
    if (base == (lysc_type *)0x0) {
      plVar24 = type_p->patterns;
      if (plVar24 == (lysp_restr *)0x0) break;
LAB_0014794a:
      plVar10 = (lysc_ext_instance *)0x0;
    }
    else {
      if ((lysc_range *)base[1].name != (lysc_range *)0x0) {
        plVar8 = lysc_range_dup(ctx,(lysc_range *)base[1].name,tpdf_chain,tpdf_chain_last);
        plVar7[1].name = (char *)plVar8;
      }
LAB_001475fb:
      plVar24 = type_p->patterns;
      if (plVar24 == (lysp_restr *)0x0) {
        if ((base != (lysc_type *)0x0) && (base[1].exts != (lysc_ext_instance *)0x0)) {
          plVar10 = (lysc_ext_instance *)lysc_patterns_dup(ctx->ctx,(lysc_pattern **)base[1].exts);
          plVar7[1].exts = plVar10;
        }
        break;
      }
      if (base == (lysc_type *)0x0) goto LAB_0014794a;
      plVar10 = base[1].exts;
    }
    LVar6 = lys_compile_type_patterns
                      (ctx,plVar24,(lysc_pattern **)plVar10,(lysc_pattern ***)&plVar7[1].exts);
    goto joined_r0x0014774a;
  case LY_TYPE_STRING:
    plVar23 = type_p->bits;
    if (plVar23 == (lysp_type_enum *)0x0) {
      if (base != (lysc_type *)0x0) {
        uVar20 = (ulong)tpdf_chain->count;
        if (tpdf_chain->count <= tpdf_chain_last) {
          __assert_fail("tpdf_chain->count > tpdf_chain_last",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_node.c"
                        ,0x71e,
                        "LY_ERR lys_compile_type_(struct lysc_ctx *, struct lysp_node *, uint16_t, const char *, const struct lysp_type *, LY_DATA_TYPE, const char *, const struct lysc_type *, struct lyplg_type *, struct ly_set *, uint32_t, struct lysc_type **)"
                       );
        }
        while (plVar23 = *(lysp_type_enum **)
                          (*(long *)(tpdf_chain->field_2).dnodes[uVar20 - 1] + 0x68),
              plVar23 == (lysp_type_enum *)0x0) {
          uVar20 = uVar20 - 1;
          if (uVar20 <= tpdf_chain_last) {
            __assert_fail("base_type_p",
                          "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_node.c"
                          ,0x72a,
                          "LY_ERR lys_compile_type_(struct lysc_ctx *, struct lysp_node *, uint16_t, const char *, const struct lysp_type *, LY_DATA_TYPE, const char *, const struct lysc_type *, struct lyplg_type *, struct ly_set *, uint32_t, struct lysc_type **)"
                         );
          }
        }
        LVar17 = LY_TYPE_BITS;
        goto LAB_00147736;
      }
      plVar25 = ctx->ctx;
      if (tpdfname == (char *)0x0) {
        tpdfname = "";
        pcVar15 = "bit";
        pcVar26 = "bits type";
      }
      else {
        pcVar15 = "bit";
        pcVar26 = "bits type ";
      }
LAB_00147c69:
      ly_vlog(plVar25,(char *)0x0,LYVE_SYNTAX_YANG,"Missing %s substatement for %s%s.",pcVar15,
              pcVar26,tpdfname);
LAB_00147c77:
      LVar6 = LY_EVALID;
      goto LAB_00146fba;
    }
    if (base == (lysc_type *)0x0) {
      base_enums = (lysc_type_bitenum_item *)0x0;
    }
    else {
      base_enums = (lysc_type_bitenum_item *)base[1].name;
    }
    LVar17 = LY_TYPE_BITS;
LAB_001476d9:
    LVar6 = lys_compile_type_enums
                      (ctx,plVar23,LVar17,base_enums,(lysc_type_bitenum_item **)(plVar7 + 1));
    goto joined_r0x0014774a;
  case LY_TYPE_BOOL:
    frdigits = type_p->fraction_digits;
    if (base == (lysc_type *)0x0) {
      if (frdigits == '\0') {
        plVar25 = ctx->ctx;
        if (tpdfname == (char *)0x0) {
          tpdfname = "";
          pcVar15 = "fraction-digits";
          pcVar26 = "decimal64 type";
        }
        else {
          pcVar15 = "fraction-digits";
          pcVar26 = "decimal64 type ";
        }
        goto LAB_00147c69;
      }
      *(uint8_t *)&plVar7[1].name = frdigits;
      plVar24 = type_p->range;
      if (plVar24 != (lysp_restr *)0x0) {
        plVar10 = (lysc_ext_instance *)0x0;
LAB_0014752a:
        pplVar28 = &type_p->range;
        range_00 = &plVar7[1].exts;
        LVar6 = lys_compile_type_range
                          (ctx,plVar24,LY_TYPE_DEC64,'\0',frdigits,(lysc_range *)plVar10,
                           (lysc_range **)range_00);
        if (LVar6 != LY_SUCCESS) goto LAB_00146fba;
        if ((tpdfname == (char *)0x0) &&
           (plVar11 = (*pplVar28)->exts, plVar11 != (lysp_ext_instance *)0x0)) {
          plVar10 = *range_00;
          lVar27 = *(long *)&plVar10->parent_stmt;
          if (lVar27 == 0) {
            plVar13 = (long *)calloc(1,(long)plVar11[-1].exts * 0x48 + 8);
            if (plVar13 != (long *)0x0) {
              lVar19 = 0;
              goto LAB_00147e8f;
            }
          }
          else {
            lVar19 = *(long *)(lVar27 + -8);
            plVar13 = (long *)realloc((void *)(lVar27 + -8),
                                      ((long)&(plVar11[-1].exts)->name + lVar19 * 2) * 0x48 + 8);
            if (plVar13 != (long *)0x0) {
              plVar10 = *range_00;
LAB_00147e8f:
              *(long **)&plVar10->parent_stmt = plVar13 + 1;
              if (*(long *)&(*range_00)->parent_stmt != 0) {
                if ((*pplVar28)->exts == (lysp_ext_instance *)0x0) {
                  plVar11 = (lysp_ext_instance *)0x0;
                }
                else {
                  plVar11 = (*pplVar28)->exts[-1].exts;
                }
                memset((void *)(*(long *)&(*range_00)->parent_stmt + *plVar13 * 0x48),0,
                       ((long)&plVar11->name + lVar19) * 0x48);
              }
              lVar27 = 0;
              plVar11 = (lysp_ext_instance *)0x0;
              while( true ) {
                plVar5 = (*pplVar28)->exts;
                if (plVar5 == (lysp_ext_instance *)0x0) {
                  plVar12 = (lysp_ext_instance *)0x0;
                }
                else {
                  plVar12 = plVar5[-1].exts;
                }
                if (plVar12 <= plVar11) break;
                plVar10 = *range_00;
                lVar19 = *(long *)&plVar10->parent_stmt;
                lVar3 = *(long *)(lVar19 + -8);
                *(long *)(lVar19 + -8) = lVar3 + 1;
                LVar6 = lys_compile_ext(ctx,(lysp_ext_instance *)((long)&plVar5->name + lVar27),
                                        (lysc_ext_instance *)(lVar19 + lVar3 * 0x48),plVar10);
                if (LVar6 != LY_SUCCESS) {
                  if (LVar6 != LY_ENOT) goto LAB_00146fba;
                  lVar19 = *(long *)&(*range_00)->parent_stmt + -8;
                  *(long *)lVar19 = *(long *)lVar19 + -1;
                }
                plVar11 = (lysp_ext_instance *)((long)&plVar11->name + 1);
                lVar27 = lVar27 + 0x70;
              }
              break;
            }
          }
          goto LAB_0014835b;
        }
      }
    }
    else {
      if (frdigits != '\0') {
        plVar25 = ctx->ctx;
        if (tpdfname != (char *)0x0) {
          pcVar15 = 
          "Invalid fraction-digits substatement for type \"%s\" not directly derived from decimal64 built-in type."
          ;
          goto LAB_0014728e;
        }
        pcVar15 = 
        "Invalid fraction-digits substatement for type not directly derived from decimal64 built-in type."
        ;
LAB_001478ca:
        LVar16 = LYVE_SYNTAX_YANG;
LAB_001478d1:
        ly_vlog(plVar25,(char *)0x0,LVar16,pcVar15);
        goto LAB_00147c77;
      }
      frdigits = *(uint8_t *)&base[1].name;
      *(uint8_t *)&plVar7[1].name = frdigits;
      plVar24 = type_p->range;
      if (plVar24 != (lysp_restr *)0x0) {
        plVar10 = base[1].exts;
        goto LAB_0014752a;
      }
    }
    break;
  case LY_TYPE_EMPTY:
    plVar23 = type_p->enums;
    if (plVar23 != (lysp_type_enum *)0x0) {
      if (base == (lysc_type *)0x0) {
        base_enums = (lysc_type_bitenum_item *)0x0;
      }
      else {
        base_enums = (lysc_type_bitenum_item *)base[1].name;
      }
      LVar17 = LY_TYPE_ENUM;
      goto LAB_001476d9;
    }
    if (base == (lysc_type *)0x0) {
      plVar25 = ctx->ctx;
      if (tpdfname == (char *)0x0) {
        tpdfname = "";
        pcVar15 = "enum";
        pcVar26 = "enumeration type";
      }
      else {
        pcVar15 = "enum";
        pcVar26 = "enumeration type ";
      }
      goto LAB_00147c69;
    }
    uVar20 = (ulong)tpdf_chain->count;
    if (tpdf_chain->count <= tpdf_chain_last) {
      __assert_fail("tpdf_chain->count > tpdf_chain_last",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_node.c"
                    ,0x781,
                    "LY_ERR lys_compile_type_(struct lysc_ctx *, struct lysp_node *, uint16_t, const char *, const struct lysp_type *, LY_DATA_TYPE, const char *, const struct lysc_type *, struct lyplg_type *, struct ly_set *, uint32_t, struct lysc_type **)"
                   );
    }
    while (plVar23 = *(lysp_type_enum **)(*(long *)(tpdf_chain->field_2).dnodes[uVar20 - 1] + 0x60),
          plVar23 == (lysp_type_enum *)0x0) {
      uVar20 = uVar20 - 1;
      if (uVar20 <= tpdf_chain_last) {
        __assert_fail("base_type_p",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_node.c"
                      ,0x78d,
                      "LY_ERR lys_compile_type_(struct lysc_ctx *, struct lysp_node *, uint16_t, const char *, const struct lysp_type *, LY_DATA_TYPE, const char *, const struct lysc_type *, struct lyplg_type *, struct ly_set *, uint32_t, struct lysc_type **)"
                     );
      }
    }
    LVar17 = LY_TYPE_ENUM;
LAB_00147736:
    LVar6 = lys_compile_type_enums
                      (ctx,plVar23,LVar17,(lysc_type_bitenum_item *)0x0,
                       (lysc_type_bitenum_item **)(plVar7 + 1));
    goto joined_r0x0014774a;
  case LY_TYPE_ENUM:
    if (type_p->bases != (char **)0x0) {
      if (base != (lysc_type *)0x0) {
        plVar25 = ctx->ctx;
        if (tpdfname == (char *)0x0) {
          pcVar15 = 
          "Invalid base substatement for the type not directly derived from identityref built-in type."
          ;
          goto LAB_001478ca;
        }
        pcVar15 = 
        "Invalid base substatement for the type \"%s\" not directly derived from identityref built-in type."
        ;
LAB_0014728e:
        LVar16 = LYVE_SYNTAX_YANG;
LAB_00147295:
        ly_vlog(plVar25,(char *)0x0,LVar16,pcVar15,tpdfname);
        goto LAB_00147c77;
      }
      LVar6 = lys_compile_identity_bases
                        (ctx,type_p->pmod,type_p->bases,(lysc_ident *)0x0,
                         (lysc_ident ***)(plVar7 + 1));
      goto joined_r0x0014774a;
    }
    if (base == (lysc_type *)0x0) {
      plVar25 = ctx->ctx;
      if (tpdfname == (char *)0x0) {
        tpdfname = "";
        pcVar15 = "base";
        pcVar26 = "identityref type";
      }
      else {
        pcVar15 = "base";
        pcVar26 = "identityref type ";
      }
      goto LAB_00147c69;
    }
    pcVar15 = plVar7[1].name;
    if (pcVar15 == (char *)0x0) {
      pcVar15 = base[1].name;
      if (pcVar15 == (char *)0x0) {
        sVar22 = 8;
      }
      else {
        sVar22 = *(long *)(pcVar15 + -8) * 8 + 8;
      }
      plVar13 = (long *)calloc(1,sVar22);
      if (plVar13 != (long *)0x0) {
        lVar27 = 0;
        goto LAB_00147d27;
      }
    }
    else {
      if (base[1].name == (char *)0x0) {
        lVar27 = 0;
      }
      else {
        lVar27 = *(long *)(base[1].name + -8);
      }
      plVar13 = (long *)realloc(pcVar15 + -8,(lVar27 + *(long *)(pcVar15 + -8)) * 8 + 8);
      if (plVar13 != (long *)0x0) {
        lVar27 = *plVar13;
        pcVar15 = base[1].name;
LAB_00147d27:
        plVar29 = plVar13 + 1;
        plVar7[1].name = (char *)plVar29;
        if (pcVar15 == (char *)0x0) {
          sVar22 = 0;
        }
        else {
          sVar22 = *(long *)(pcVar15 + -8) << 3;
        }
        uVar20 = 0;
        memset(plVar13 + lVar27 + 1,0,sVar22);
        while( true ) {
          if (pcVar15 == (char *)0x0) {
            uVar21 = 0;
          }
          else {
            uVar21 = *(ulong *)(pcVar15 + -8);
          }
          if (uVar21 <= uVar20) break;
          plVar29[uVar20] = *(long *)(pcVar15 + uVar20 * 8);
          plVar29 = (long *)plVar7[1].name;
          plVar29[-1] = plVar29[-1] + 1;
          uVar20 = uVar20 + 1;
          pcVar15 = base[1].name;
        }
        break;
      }
    }
    goto LAB_0014835b;
  case LY_TYPE_IDENT:
    if ((type_p->flags & 0x200) == 0) {
      *(undefined1 *)&plVar7[1].name = 1;
    }
    else {
      *(uint8_t *)&plVar7[1].name = type_p->require_instance;
    }
    break;
  case LY_TYPE_INST:
    if ((type_p->flags & 0x200) == 0) {
      if (base != (lysc_type *)0x0) {
        pLVar9 = &base[1].basetype;
        goto LAB_00147492;
      }
      *(undefined1 *)&plVar7[1].basetype = LY_TYPE_BINARY;
      exp = type_p->path;
      if (exp == (lyxp_expr *)0x0) goto LAB_00147886;
    }
    else {
      if (type_p->pmod->version < 2) {
        plVar25 = ctx->ctx;
        if (tpdfname == (char *)0x0) {
          pcVar15 = 
          "Leafref type can be restricted by require-instance statement only in YANG 1.1 modules.";
          LVar16 = LYVE_SEMANTICS;
          goto LAB_001478d1;
        }
        pcVar15 = 
        "Leafref type \"%s\" can be restricted by require-instance statement only in YANG 1.1 modules."
        ;
        LVar16 = LYVE_SEMANTICS;
        goto LAB_00147295;
      }
      pLVar9 = (LY_DATA_TYPE *)&type_p->require_instance;
LAB_00147492:
      *(char *)&plVar7[1].basetype = (char)*pLVar9;
      exp = type_p->path;
      if (exp == (lyxp_expr *)0x0) {
        if (base == (lysc_type *)0x0) {
LAB_00147886:
          plVar25 = ctx->ctx;
          if (tpdfname == (char *)0x0) {
            tpdfname = "";
            pcVar15 = "path";
            pcVar26 = "leafref type";
          }
          else {
            pcVar15 = "path";
            pcVar26 = "leafref type ";
          }
          goto LAB_00147c69;
        }
        LVar6 = lyxp_expr_dup(ctx->ctx,(lyxp_expr *)base[1].name,0,0,(lyxp_expr **)(plVar7 + 1));
        if (LVar6 != LY_SUCCESS) goto LAB_00146fba;
        LVar6 = lyplg_type_prefix_data_dup
                          (ctx->ctx,LY_VALUE_SCHEMA_RESOLVED,base[1].exts,&plVar7[1].exts);
        goto joined_r0x0014774a;
      }
    }
    LVar6 = lyxp_expr_dup(ctx->ctx,exp,0,0,(lyxp_expr **)(plVar7 + 1));
    if (LVar6 != LY_SUCCESS) goto LAB_00146fba;
    plVar25 = ctx->ctx;
    pcVar15 = type_p->path->expr;
    sVar22 = strlen(pcVar15);
    LVar6 = lyplg_type_prefix_data_new
                      (plVar25,pcVar15,sVar22,LY_VALUE_SCHEMA,type_p->pmod,&local_34,&plVar7[1].exts
                      );
    if (LVar6 != LY_SUCCESS) {
      return LY_SUCCESS;
    }
    break;
  case LY_TYPE_LEAFREF:
    if (type_p->types == (lysp_type *)0x0) {
      if (base == (lysc_type *)0x0) {
        plVar25 = ctx->ctx;
        if (tpdfname == (char *)0x0) {
          tpdfname = "";
          pcVar15 = "type";
          pcVar26 = "union type";
        }
        else {
          pcVar15 = "type";
          pcVar26 = "union type ";
        }
        goto LAB_00147c69;
      }
      pcVar15 = plVar7[1].name;
      if (pcVar15 == (char *)0x0) {
        pcVar15 = base[1].name;
        if (pcVar15 == (char *)0x0) {
          sVar22 = 8;
        }
        else {
          sVar22 = *(long *)(pcVar15 + -8) * 8 + 8;
        }
        plVar13 = (long *)calloc(1,sVar22);
        if (plVar13 != (long *)0x0) {
          lVar27 = 0;
          goto LAB_00147c9c;
        }
      }
      else {
        if (base[1].name == (char *)0x0) {
          lVar27 = 0;
        }
        else {
          lVar27 = *(long *)(base[1].name + -8);
        }
        plVar13 = (long *)realloc(pcVar15 + -8,(lVar27 + *(long *)(pcVar15 + -8)) * 8 + 8);
        if (plVar13 != (long *)0x0) {
          lVar27 = *plVar13;
          pcVar15 = base[1].name;
LAB_00147c9c:
          plVar29 = plVar13 + 1;
          plVar7[1].name = (char *)plVar29;
          if (pcVar15 == (char *)0x0) {
            sVar22 = 0;
          }
          else {
            sVar22 = *(long *)(pcVar15 + -8) << 3;
          }
          uVar20 = 0;
          memset(plVar13 + lVar27 + 1,0,sVar22);
          while( true ) {
            if (pcVar15 == (char *)0x0) {
              uVar21 = 0;
            }
            else {
              uVar21 = *(ulong *)(pcVar15 + -8);
            }
            if (uVar21 <= uVar20) break;
            plVar29[uVar20] = *(long *)(pcVar15 + uVar20 * 8);
            LOCK();
            piVar2 = (int *)(*(long *)(plVar7[1].name + uVar20 * 8) + 0x1c);
            *piVar2 = *piVar2 + 1;
            UNLOCK();
            plVar29 = (long *)plVar7[1].name;
            plVar29[-1] = plVar29[-1] + 1;
            uVar20 = uVar20 + 1;
            pcVar15 = base[1].name;
          }
          break;
        }
      }
      goto LAB_0014835b;
    }
    if (base != (lysc_type *)0x0) {
      plVar25 = ctx->ctx;
      if (tpdfname == (char *)0x0) {
        pcVar15 = 
        "Invalid type substatement for the type not directly derived from union built-in type.";
        goto LAB_001478ca;
      }
      pcVar15 = 
      "Invalid type substatement for the type \"%s\" not directly derived from union built-in type."
      ;
      goto LAB_0014728e;
    }
    LVar6 = lys_compile_type_union
                      (ctx,type_p->types,context_pnode,context_flags,context_name,
                       (lysc_type ***)(plVar7 + 1));
joined_r0x0014774a:
    if (LVar6 != LY_SUCCESS) goto LAB_00146fba;
  }
  uVar20 = (ulong)tpdf_chain->count;
  if (tpdf_chain_last < tpdf_chain->count) {
    do {
      plVar4 = (tpdf_chain->field_2).dnodes[uVar20 - 1];
      lVar27 = *(long *)(*(long *)plVar4 + 0x88);
      if (lVar27 != 0) {
        plVar7 = *type;
        plVar10 = plVar7->exts;
        if (plVar10 == (lysc_ext_instance *)0x0) {
          plVar13 = (long *)calloc(1,*(long *)(lVar27 + -8) * 0x48 + 8);
          if (plVar13 == (long *)0x0) goto LAB_0014835b;
          pvVar18 = (void *)0x0;
        }
        else {
          pvVar18 = plVar10[-1].compiled;
          plVar13 = (long *)realloc(&plVar10[-1].compiled,
                                    ((long)pvVar18 * 2 + *(long *)(lVar27 + -8)) * 0x48 + 8);
          if (plVar13 == (long *)0x0) goto LAB_0014835b;
          plVar7 = *type;
        }
        plVar7->exts = (lysc_ext_instance *)(plVar13 + 1);
        if ((*type)->exts != (lysc_ext_instance *)0x0) {
          if (*(long *)(*(long *)plVar4 + 0x88) == 0) {
            lVar27 = 0;
          }
          else {
            lVar27 = *(long *)(*(long *)(*(long *)plVar4 + 0x88) + -8);
          }
          memset((*type)->exts + *plVar13,0,(lVar27 + (long)pvVar18) * 0x48);
        }
        lVar27 = 0;
        uVar21 = 0;
        while( true ) {
          lVar19 = *(long *)(*(long *)plVar4 + 0x88);
          if (lVar19 == 0) {
            uVar14 = 0;
          }
          else {
            uVar14 = *(ulong *)(lVar19 + -8);
          }
          if (uVar14 <= uVar21) break;
          plVar7 = *type;
          plVar10 = plVar7->exts;
          pvVar18 = plVar10[-1].compiled;
          plVar10[-1].compiled = (void *)((long)pvVar18 + 1);
          LVar6 = lys_compile_ext(ctx,(lysp_ext_instance *)(lVar19 + lVar27),plVar10 + (long)pvVar18
                                  ,plVar7);
          if (LVar6 != LY_SUCCESS) {
            if (LVar6 != LY_ENOT) goto LAB_00146fba;
            ppvVar1 = &(*type)->exts[-1].compiled;
            *ppvVar1 = (void *)((long)*ppvVar1 + -1);
          }
          uVar21 = uVar21 + 1;
          lVar27 = lVar27 + 0x70;
        }
      }
      uVar20 = uVar20 - 1;
    } while (tpdf_chain_last < uVar20);
  }
  plVar11 = type_p->exts;
  if (plVar11 == (lysp_ext_instance *)0x0) {
    return LY_SUCCESS;
  }
  plVar7 = *type;
  plVar10 = plVar7->exts;
  if (plVar10 == (lysc_ext_instance *)0x0) {
    plVar13 = (long *)calloc(1,(long)plVar11[-1].exts * 0x48 + 8);
    if (plVar13 != (long *)0x0) {
      pvVar18 = (void *)0x0;
      goto LAB_00148297;
    }
  }
  else {
    pvVar18 = plVar10[-1].compiled;
    plVar13 = (long *)realloc(&plVar10[-1].compiled,
                              ((long)&(plVar11[-1].exts)->name + (long)pvVar18 * 2) * 0x48 + 8);
    if (plVar13 != (long *)0x0) {
      plVar7 = *type;
LAB_00148297:
      plVar7->exts = (lysc_ext_instance *)(plVar13 + 1);
      if ((*type)->exts != (lysc_ext_instance *)0x0) {
        if (type_p->exts == (lysp_ext_instance *)0x0) {
          plVar11 = (lysp_ext_instance *)0x0;
        }
        else {
          plVar11 = type_p->exts[-1].exts;
        }
        memset((*type)->exts + *plVar13,0,((long)&plVar11->name + (long)pvVar18) * 0x48);
      }
      lVar27 = 0;
      plVar11 = (lysp_ext_instance *)0x0;
      do {
        plVar5 = type_p->exts;
        if (plVar5 == (lysp_ext_instance *)0x0) {
          plVar12 = (lysp_ext_instance *)0x0;
        }
        else {
          plVar12 = plVar5[-1].exts;
        }
        if (plVar12 <= plVar11) {
          return LY_SUCCESS;
        }
        plVar7 = *type;
        plVar10 = plVar7->exts;
        pvVar18 = plVar10[-1].compiled;
        plVar10[-1].compiled = (void *)((long)pvVar18 + 1);
        LVar6 = lys_compile_ext(ctx,(lysp_ext_instance *)((long)&plVar5->name + lVar27),
                                plVar10 + (long)pvVar18,plVar7);
        if (LVar6 != LY_SUCCESS) {
          if (LVar6 != LY_ENOT) goto LAB_00146fba;
          ppvVar1 = &(*type)->exts[-1].compiled;
          *ppvVar1 = (void *)((long)*ppvVar1 + -1);
        }
        plVar11 = (lysp_ext_instance *)((long)&plVar11->name + 1);
        lVar27 = lVar27 + 0x70;
      } while( true );
    }
  }
LAB_0014835b:
  LVar6 = LY_EMEM;
  ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile_type_");
LAB_00146fba:
  LOCK();
  (*type)->refcount = (*type)->refcount + 1;
  UNLOCK();
  lysc_type_free(&ctx->free_ctx,*type);
  *type = (lysc_type *)0x0;
  return LVar6;
}

Assistant:

static LY_ERR
lys_compile_type_(struct lysc_ctx *ctx, struct lysp_node *context_pnode, uint16_t context_flags, const char *context_name,
        const struct lysp_type *type_p, LY_DATA_TYPE basetype, const char *tpdfname, const struct lysc_type *base,
        struct lyplg_type *plugin, struct ly_set *tpdf_chain, uint32_t tpdf_chain_last, struct lysc_type **type)
{
    LY_ERR rc = LY_SUCCESS;
    struct lysc_type_bin *bin;
    struct lysc_type_num *num;
    struct lysc_type_str *str;
    struct lysc_type_bits *bits;
    struct lysc_type_enum *enumeration;
    struct lysc_type_dec *dec;
    struct lysc_type_identityref *idref;
    struct lysc_type_leafref *lref;
    struct lysc_type_union *un;
    struct lys_type_item *tpdf_item;
    const struct lysp_type *base_type_p;
    uint32_t i;

    /* alloc and init */
    rc = lys_new_type(ctx->ctx, basetype, tpdfname, type);
    LY_CHECK_GOTO(rc, cleanup);

    (*type)->basetype = basetype;
    (*type)->plugin = plugin;

    switch (basetype) {
    case LY_TYPE_BINARY:
        bin = (struct lysc_type_bin *)*type;

        /* RFC 7950 9.8.1, 9.4.4 - length, number of octets it contains */
        if (type_p->length) {
            LY_CHECK_GOTO(rc = lys_compile_type_range(ctx, type_p->length, basetype, 1, 0,
                    base ? ((struct lysc_type_bin *)base)->length : NULL, &bin->length), cleanup);
            if (!tpdfname) {
                COMPILE_EXTS_GOTO(ctx, type_p->length->exts, bin->length->exts, bin->length, rc, cleanup);
            }
        }
        break;
    case LY_TYPE_BITS:
        /* RFC 7950 9.7 - bits */
        bits = (struct lysc_type_bits *)*type;
        if (type_p->bits) {
            /* compile bits from this type */
            LY_CHECK_GOTO(rc = lys_compile_type_enums(ctx, type_p->bits, basetype,
                    base ? (struct lysc_type_bitenum_item *)((struct lysc_type_bits *)base)->bits : NULL,
                    (struct lysc_type_bitenum_item **)&bits->bits), cleanup);
        } else if (base) {
            /* recompile bits from the first superior type with bits */
            assert(tpdf_chain->count > tpdf_chain_last);
            base_type_p = NULL;
            i = tpdf_chain->count;
            do {
                --i;
                tpdf_item = tpdf_chain->objs[i];

                if (tpdf_item->tpdf->type.bits) {
                    base_type_p = &tpdf_item->tpdf->type;
                    break;
                }
            } while (i > tpdf_chain_last);
            assert(base_type_p);

            LY_CHECK_GOTO(rc = lys_compile_type_enums(ctx, base_type_p->bits, basetype, NULL,
                    (struct lysc_type_bitenum_item **)&bits->bits), cleanup);
        } else {
            /* type derived from bits built-in type must contain at least one bit */
            if (tpdfname) {
                LOGVAL(ctx->ctx, LY_VCODE_MISSCHILDSTMT, "bit", "bits type ", tpdfname);
            } else {
                LOGVAL(ctx->ctx, LY_VCODE_MISSCHILDSTMT, "bit", "bits type", "");
            }
            rc = LY_EVALID;
            goto cleanup;
        }
        break;
    case LY_TYPE_DEC64:
        dec = (struct lysc_type_dec *)*type;

        /* RFC 7950 9.3.4 - fraction-digits */
        if (!base) {
            if (!type_p->fraction_digits) {
                if (tpdfname) {
                    LOGVAL(ctx->ctx, LY_VCODE_MISSCHILDSTMT, "fraction-digits", "decimal64 type ", tpdfname);
                } else {
                    LOGVAL(ctx->ctx, LY_VCODE_MISSCHILDSTMT, "fraction-digits", "decimal64 type", "");
                }
                rc = LY_EVALID;
                goto cleanup;
            }
            dec->fraction_digits = type_p->fraction_digits;
        } else {
            if (type_p->fraction_digits) {
                /* fraction digits is prohibited in types not directly derived from built-in decimal64 */
                if (tpdfname) {
                    LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                            "Invalid fraction-digits substatement for type \"%s\" not directly derived from decimal64 built-in type.",
                            tpdfname);
                } else {
                    LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                            "Invalid fraction-digits substatement for type not directly derived from decimal64 built-in type.");
                }
                rc = LY_EVALID;
                goto cleanup;
            }
            dec->fraction_digits = ((struct lysc_type_dec *)base)->fraction_digits;
        }

        /* RFC 7950 9.2.4 - range */
        if (type_p->range) {
            LY_CHECK_GOTO(rc = lys_compile_type_range(ctx, type_p->range, basetype, 0, dec->fraction_digits,
                    base ? ((struct lysc_type_dec *)base)->range : NULL, &dec->range), cleanup);
            if (!tpdfname) {
                COMPILE_EXTS_GOTO(ctx, type_p->range->exts, dec->range->exts, dec->range, rc, cleanup);
            }
        }
        break;
    case LY_TYPE_STRING:
        str = (struct lysc_type_str *)*type;

        /* RFC 7950 9.4.4 - length */
        if (type_p->length) {
            LY_CHECK_GOTO(rc = lys_compile_type_range(ctx, type_p->length, basetype, 1, 0,
                    base ? ((struct lysc_type_str *)base)->length : NULL, &str->length), cleanup);
            if (!tpdfname) {
                COMPILE_EXTS_GOTO(ctx, type_p->length->exts, str->length->exts, str->length, rc, cleanup);
            }
        } else if (base && ((struct lysc_type_str *)base)->length) {
            str->length = lysc_range_dup(ctx, ((struct lysc_type_str *)base)->length, tpdf_chain, tpdf_chain_last);
        }

        /* RFC 7950 9.4.5 - pattern */
        if (type_p->patterns) {
            LY_CHECK_GOTO(rc = lys_compile_type_patterns(ctx, type_p->patterns,
                    base ? ((struct lysc_type_str *)base)->patterns : NULL, &str->patterns), cleanup);
        } else if (base && ((struct lysc_type_str *)base)->patterns) {
            str->patterns = lysc_patterns_dup(ctx->ctx, ((struct lysc_type_str *)base)->patterns);
        }
        break;
    case LY_TYPE_ENUM:
        enumeration = (struct lysc_type_enum *)*type;

        /* RFC 7950 9.6 - enum */
        if (type_p->enums) {
            LY_CHECK_GOTO(rc = lys_compile_type_enums(ctx, type_p->enums, basetype,
                    base ? ((struct lysc_type_enum *)base)->enums : NULL, &enumeration->enums), cleanup);
        } else if (base) {
            /* recompile enums from the first superior type with enums */
            assert(tpdf_chain->count > tpdf_chain_last);
            base_type_p = NULL;
            i = tpdf_chain->count;
            do {
                --i;
                tpdf_item = tpdf_chain->objs[i];

                if (tpdf_item->tpdf->type.enums) {
                    base_type_p = &tpdf_item->tpdf->type;
                    break;
                }
            } while (i > tpdf_chain_last);
            assert(base_type_p);

            LY_CHECK_GOTO(rc = lys_compile_type_enums(ctx, base_type_p->enums, basetype, NULL, &enumeration->enums), cleanup);
        } else {
            /* type derived from enumerations built-in type must contain at least one enum */
            if (tpdfname) {
                LOGVAL(ctx->ctx, LY_VCODE_MISSCHILDSTMT, "enum", "enumeration type ", tpdfname);
            } else {
                LOGVAL(ctx->ctx, LY_VCODE_MISSCHILDSTMT, "enum", "enumeration type", "");
            }
            rc = LY_EVALID;
            goto cleanup;
        }
        break;
    case LY_TYPE_INT8:
    case LY_TYPE_UINT8:
    case LY_TYPE_INT16:
    case LY_TYPE_UINT16:
    case LY_TYPE_INT32:
    case LY_TYPE_UINT32:
    case LY_TYPE_INT64:
    case LY_TYPE_UINT64:
        num = (struct lysc_type_num *)*type;

        /* RFC 6020 9.2.4 - range */
        if (type_p->range) {
            LY_CHECK_GOTO(rc = lys_compile_type_range(ctx, type_p->range, basetype, 0, 0,
                    base ? ((struct lysc_type_num *)base)->range : NULL, &num->range), cleanup);
            if (!tpdfname) {
                COMPILE_EXTS_GOTO(ctx, type_p->range->exts, num->range->exts, num->range, rc, cleanup);
            }
        }
        break;
    case LY_TYPE_IDENT:
        idref = (struct lysc_type_identityref *)*type;

        /* RFC 7950 9.10.2 - base */
        if (type_p->bases) {
            if (base) {
                /* only the directly derived identityrefs can contain base specification */
                if (tpdfname) {
                    LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                            "Invalid base substatement for the type \"%s\" not directly derived from identityref built-in type.",
                            tpdfname);
                } else {
                    LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                            "Invalid base substatement for the type not directly derived from identityref built-in type.");
                }
                rc = LY_EVALID;
                goto cleanup;
            }
            LY_CHECK_GOTO(rc = lys_compile_identity_bases(ctx, type_p->pmod, type_p->bases, NULL, &idref->bases), cleanup);
        } else if (base) {
            /* copy all the bases */
            const struct lysc_type_identityref *idref_base = (struct lysc_type_identityref *)base;
            LY_ARRAY_COUNT_TYPE u;

            LY_ARRAY_CREATE_GOTO(ctx->ctx, idref->bases, LY_ARRAY_COUNT(idref_base->bases), rc, cleanup);
            LY_ARRAY_FOR(idref_base->bases, u) {
                idref->bases[u] = idref_base->bases[u];
                LY_ARRAY_INCREMENT(idref->bases);
            }
        } else {
            /* type derived from identityref built-in type must contain at least one base */
            if (tpdfname) {
                LOGVAL(ctx->ctx, LY_VCODE_MISSCHILDSTMT, "base", "identityref type ", tpdfname);
            } else {
                LOGVAL(ctx->ctx, LY_VCODE_MISSCHILDSTMT, "base", "identityref type", "");
            }
            rc = LY_EVALID;
            goto cleanup;
        }
        break;
    case LY_TYPE_LEAFREF:
        lref = (struct lysc_type_leafref *)*type;

        /* RFC 7950 9.9.3 - require-instance */
        if (type_p->flags & LYS_SET_REQINST) {
            if (type_p->pmod->version < LYS_VERSION_1_1) {
                if (tpdfname) {
                    LOGVAL(ctx->ctx, LYVE_SEMANTICS,
                            "Leafref type \"%s\" can be restricted by require-instance statement only in YANG 1.1 modules.", tpdfname);
                } else {
                    LOGVAL(ctx->ctx, LYVE_SEMANTICS,
                            "Leafref type can be restricted by require-instance statement only in YANG 1.1 modules.");
                }
                rc = LY_EVALID;
                goto cleanup;
            }
            lref->require_instance = type_p->require_instance;
        } else if (base) {
            /* inherit */
            lref->require_instance = ((struct lysc_type_leafref *)base)->require_instance;
        } else {
            /* default is true */
            lref->require_instance = 1;
        }
        if (type_p->path) {
            LY_VALUE_FORMAT format;

            LY_CHECK_GOTO(rc = lyxp_expr_dup(ctx->ctx, type_p->path, 0, 0, &lref->path), cleanup);
            LY_CHECK_GOTO(lyplg_type_prefix_data_new(ctx->ctx, type_p->path->expr, strlen(type_p->path->expr),
                    LY_VALUE_SCHEMA, type_p->pmod, &format, (void **)&lref->prefixes), cleanup);
        } else if (base) {
            LY_CHECK_GOTO(rc = lyxp_expr_dup(ctx->ctx, ((struct lysc_type_leafref *)base)->path, 0, 0, &lref->path), cleanup);
            LY_CHECK_GOTO(rc = lyplg_type_prefix_data_dup(ctx->ctx, LY_VALUE_SCHEMA_RESOLVED,
                    ((struct lysc_type_leafref *)base)->prefixes, (void **)&lref->prefixes), cleanup);
        } else {
            /* type derived from leafref built-in type must contain path */
            if (tpdfname) {
                LOGVAL(ctx->ctx, LY_VCODE_MISSCHILDSTMT, "path", "leafref type ", tpdfname);
            } else {
                LOGVAL(ctx->ctx, LY_VCODE_MISSCHILDSTMT, "path", "leafref type", "");
            }
            rc = LY_EVALID;
            goto cleanup;
        }
        break;
    case LY_TYPE_INST:
        /* RFC 7950 9.9.3 - require-instance */
        if (type_p->flags & LYS_SET_REQINST) {
            ((struct lysc_type_instanceid *)*type)->require_instance = type_p->require_instance;
        } else {
            /* default is true */
            ((struct lysc_type_instanceid *)*type)->require_instance = 1;
        }
        break;
    case LY_TYPE_UNION:
        un = (struct lysc_type_union *)*type;

        /* RFC 7950 7.4 - type */
        if (type_p->types) {
            if (base) {
                /* only the directly derived union can contain types specification */
                if (tpdfname) {
                    LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                            "Invalid type substatement for the type \"%s\" not directly derived from union built-in type.",
                            tpdfname);
                } else {
                    LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                            "Invalid type substatement for the type not directly derived from union built-in type.");
                }
                rc = LY_EVALID;
                goto cleanup;
            }
            /* compile the type */
            LY_CHECK_GOTO(rc = lys_compile_type_union(ctx, type_p->types, context_pnode, context_flags, context_name,
                    &un->types), cleanup);
        } else if (base) {
            /* copy all the types */
            const struct lysc_type_union *un_base = (struct lysc_type_union *)base;
            LY_ARRAY_COUNT_TYPE u;

            LY_ARRAY_CREATE_GOTO(ctx->ctx, un->types, LY_ARRAY_COUNT(un_base->types), rc, cleanup);
            LY_ARRAY_FOR(un_base->types, u) {
                un->types[u] = un_base->types[u];
                LY_ATOMIC_INC_BARRIER(un->types[u]->refcount);
                LY_ARRAY_INCREMENT(un->types);
            }
        } else {
            /* type derived from union built-in type must contain at least one type */
            if (tpdfname) {
                LOGVAL(ctx->ctx, LY_VCODE_MISSCHILDSTMT, "type", "union type ", tpdfname);
            } else {
                LOGVAL(ctx->ctx, LY_VCODE_MISSCHILDSTMT, "type", "union type", "");
            }
            rc = LY_EVALID;
            goto cleanup;
        }
        break;
    case LY_TYPE_BOOL:
    case LY_TYPE_EMPTY:
    case LY_TYPE_UNKNOWN: /* just to complete switch */
        break;
    }

    if (tpdf_chain->count > tpdf_chain_last) {
        i = tpdf_chain->count;
        do {
            --i;
            tpdf_item = tpdf_chain->objs[i];

            /* compile previous typedefs extensions */
            COMPILE_EXTS_GOTO(ctx, tpdf_item->tpdf->type.exts, (*type)->exts, *type, rc, cleanup);
        } while (i > tpdf_chain_last);
    }

    /* compile new parsed extensions */
    COMPILE_EXTS_GOTO(ctx, type_p->exts, (*type)->exts, *type, rc, cleanup);

cleanup:
    if (rc) {
        LY_ATOMIC_INC_BARRIER((*type)->refcount);
        lysc_type_free(&ctx->free_ctx, *type);
        *type = NULL;
    }
    return rc;
}